

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

QIcon __thiscall QComboBoxPrivate::itemIcon(QComboBoxPrivate *this,QModelIndex *index)

{
  bool bVar1;
  int iVar2;
  QModelIndex *in_RDX;
  long in_FS_OFFSET;
  QPixmap local_60 [24];
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QModelIndex::isValid(in_RDX);
  if (bVar1) {
    local_48._16_4_ = 0xaaaaaaaa;
    local_48._20_4_ = 0xaaaaaaaa;
    uStack_30 = 0xaaaaaaaa;
    uStack_2c = 0xaaaaaaaa;
    local_48._0_4_ = 0xaaaaaaaa;
    local_48._4_4_ = 0xaaaaaaaa;
    local_48._8_4_ = 0xaaaaaaaa;
    local_48._12_4_ = 0xaaaaaaaa;
    (**(code **)(*(long *)index[0x1b].m.ptr + 0x90))(&local_48);
    iVar2 = ::QVariant::typeId((QVariant *)&local_48);
    if (iVar2 == 0x1001) {
      qvariant_cast<QPixmap>((QVariant *)local_60);
      QIcon::QIcon((QIcon *)this,(QPixmap *)local_60);
      QPixmap::~QPixmap(local_60);
    }
    else {
      qvariant_cast<QIcon>((QVariant *)this);
    }
    ::QVariant::~QVariant((QVariant *)&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
LAB_003b1644:
      __stack_chk_fail();
    }
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_003b1644;
    QIcon::QIcon((QIcon *)this);
  }
  return (QIcon)(QIconPrivate *)this;
}

Assistant:

QIcon QComboBoxPrivate::itemIcon(const QModelIndex &index) const
{
    if (!index.isValid())
        return {};
    QVariant decoration = model->data(index, Qt::DecorationRole);
    if (decoration.userType() == QMetaType::QPixmap)
        return QIcon(qvariant_cast<QPixmap>(decoration));
    else
        return qvariant_cast<QIcon>(decoration);
}